

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::Loggers::hasLogger(string *identity)

{
  bool bVar1;
  element_type *this;
  RegisteredLoggers *this_00;
  string *identity_local;
  
  this = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)el::base::elStorage);
  this_00 = el::base::Storage::registeredLoggers(this);
  bVar1 = el::base::RegisteredLoggers::has(this_00,identity);
  return bVar1;
}

Assistant:

bool Loggers::hasLogger(const std::string& identity) {
  return ELPP->registeredLoggers()->has(identity);
}